

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O2

GLvoid __thiscall
glcts::anon_unknown_0::GatherBase::CreateTexture2DArray(GatherBase *this,int slices,int data_slice)

{
  CallLogWrapper *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  uint width;
  GLenum GVar4;
  undefined4 in_register_00000034;
  allocator_type local_a1;
  uint local_a0;
  int local_9c;
  undefined8 local_98;
  undefined8 local_90;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixels;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Vector<float,_4> local_40;
  
  local_90 = CONCAT44(in_register_00000034,slices);
  local_9c = data_slice;
  local_a0 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])();
  iVar2 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x22])(this);
  local_98 = CONCAT44(extraout_var,iVar2);
  this_00 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->tex);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,this->tex);
  width = 0x20;
  for (iVar2 = 0; iVar3 = local_9c, iVar2 != 6; iVar2 = iVar2 + 1) {
    iVar3 = width * (int)local_90;
    tcu::Vector<float,_4>::Vector(&local_40,1.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &pixels.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>,
               (long)(int)(iVar3 * width),&local_40,&local_a1);
    glu::CallLogWrapper::glTexImage3D
              (this_00,0x8c1a,iVar2,local_a0,width,width,(GLsizei)local_90,0,(GLenum)local_98,0x1406
               ,pixels.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&pixels.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    width = width >> 1;
  }
  pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3f5000003f400000;
  pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x3f7000003f600000;
  pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x3f1000003f000000;
  local_68 = 0x3d80000000000000;
  uStack_60 = 0x3e4000003e000000;
  local_58 = 0x3ea000003e800000;
  uStack_50 = 0x3ee000003ec00000;
  GVar4 = (GLenum)local_98;
  glu::CallLogWrapper::glTexSubImage3D
            (this_00,0x8c1a,0,0x16,0x19,local_9c,2,2,1,GVar4,0x1406,&pixels);
  glu::CallLogWrapper::glTexSubImage3D(this_00,0x8c1a,0,0x10,10,iVar3,1,1,1,GVar4,0x1406,&pixels);
  glu::CallLogWrapper::glTexSubImage3D
            (this_00,0x8c1a,0,0xb,2,iVar3,1,1,1,GVar4,0x1406,
             &pixels.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  glu::CallLogWrapper::glTexSubImage3D(this_00,0x8c1a,0,0x18,0xd,iVar3,1,1,1,GVar4,0x1406,&local_68)
  ;
  glu::CallLogWrapper::glTexSubImage3D(this_00,0x8c1a,0,9,0xe,iVar3,1,1,1,GVar4,0x1406,&local_58);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2803,0x812f);
  GVar4 = 0x8c1a;
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x8072,0x812f);
  bVar1 = IsFloatingPointTexture((GatherBase *)(ulong)local_a0,GVar4);
  if (bVar1) {
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2800,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2801,0x2700);
  }
  return;
}

Assistant:

virtual GLvoid CreateTexture2DArray(int slices, int data_slice)
	{
		GLenum		internal_format = InternalFormat();
		GLenum		format			= Format();
		const GLint csize			= 32;
		GLint		size			= csize;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D_ARRAY, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			std::vector<Vec4> pixels(size * size * slices, Vec4(1.0));
			glTexImage3D(GL_TEXTURE_2D_ARRAY, i, internal_format, size, size, slices, 0, format, GL_FLOAT, &pixels[0]);
		}

		Vec4 data[4] = { Vec4(12. / 16, 13. / 16, 14. / 16, 15. / 16), Vec4(8. / 16, 9. / 16, 10. / 16, 11. / 16),
						 Vec4(0. / 16, 1. / 16, 2. / 16, 3. / 16), Vec4(4. / 16, 5. / 16, 6. / 16, 7. / 16) };

		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 22, 25, data_slice, 2, 2, 1, format, GL_FLOAT, data);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 16, 10, data_slice, 1, 1, 1, format, GL_FLOAT, data + 0);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 11, 2, data_slice, 1, 1, 1, format, GL_FLOAT, data + 1);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 24, 13, data_slice, 1, 1, 1, format, GL_FLOAT, data + 2);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 9, 14, data_slice, 1, 1, 1, format, GL_FLOAT, data + 3);

		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);

		if (IsFloatingPointTexture(internal_format))
		{
			glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);
		}
	}